

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void uv_sleep(uint msec)

{
  int iVar1;
  int *piVar2;
  timespec timeout;
  timespec local_18;
  
  local_18.tv_sec = (ulong)msec / 1000;
  local_18.tv_nsec = (long)((msec % 1000) * 1000000);
  do {
    iVar1 = nanosleep(&local_18,&local_18);
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        return;
      }
      break;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  __assert_fail("rc == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                ,0x61d,"void uv_sleep(unsigned int)");
}

Assistant:

void uv_sleep(unsigned int msec) {
  struct timespec timeout;
  int rc;

  timeout.tv_sec = msec / 1000;
  timeout.tv_nsec = (msec % 1000) * 1000 * 1000;

  do
    rc = nanosleep(&timeout, &timeout);
  while (rc == -1 && errno == EINTR);

  assert(rc == 0);
}